

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O1

int __thiscall YAML::RegEx::Match<YAML::StringCharSource>(RegEx *this,StringCharSource *source)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = source->m_offset;
  iVar2 = -1;
  if (uVar1 < source->m_size || this->m_op - REGEX_OR < 0xfffffffe) {
    switch(this->m_op) {
    case REGEX_EMPTY:
      iVar2 = -(uint)(uVar1 < source->m_size);
      break;
    case REGEX_MATCH:
      return (uint)(source->m_str[uVar1] == this->m_a) * 2 + -1;
    case REGEX_RANGE:
      return -(uint)(this->m_z < source->m_str[uVar1] || source->m_str[uVar1] < this->m_a) | 1;
    case REGEX_OR:
      iVar2 = MatchOpOr<YAML::StringCharSource>(this,source);
      return iVar2;
    case REGEX_AND:
      iVar2 = MatchOpAnd<YAML::StringCharSource>(this,source);
      return iVar2;
    case REGEX_NOT:
      iVar2 = MatchOpNot<YAML::StringCharSource>(this,source);
      return iVar2;
    case REGEX_SEQ:
      iVar2 = MatchOpSeq<YAML::StringCharSource>(this,source);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

inline bool RegEx::IsValidSource<StringCharSource>(
    const StringCharSource& source) const {
  switch (m_op) {
    case REGEX_MATCH:
    case REGEX_RANGE:
      return source;
    default:
      return true;
  }
}